

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ht.c
# Opt level: O3

void lgx_ht_cleanup(lgx_ht_t *ht)

{
  lgx_ht_node_s *plVar1;
  uint uVar2;
  lgx_ht_node_t *node;
  ulong uVar3;
  
  uVar2 = ht->size;
  if (uVar2 != 0) {
    uVar3 = 0;
    do {
      node = ht->table[uVar3];
      if (ht->table[uVar3] != (lgx_ht_node_t *)0x0) {
        do {
          plVar1 = node->next;
          ht_node_del(node);
          node = plVar1;
        } while (plVar1 != (lgx_ht_node_s *)0x0);
        uVar2 = ht->size;
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 < uVar2);
  }
  free(ht->table);
  ht->head = (lgx_ht_node_t *)0x0;
  ht->tail = (lgx_ht_node_t *)0x0;
  ht->size = 0;
  ht->length = 0;
  ht->table = (lgx_ht_node_t **)0x0;
  return;
}

Assistant:

void lgx_ht_cleanup(lgx_ht_t* ht) {
    int i;
    lgx_ht_node_t *node, *next;
    for (i = 0; i < ht->size; i++) {
        node = ht->table[i];
        while (node) {
            next = node->next;
            ht_node_del(node);
            node = next;
        }
    }

    xfree(ht->table);

    memset(ht, 0, sizeof(lgx_ht_t));
}